

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O2

void zt_time_result_to_elapsed(time_result *result,float *usr,float *sys,float *total)

{
  float fVar1;
  
  *usr = (float)((double)(result->usr_time).tv_usec / 1000000.0 + (double)(result->usr_time).tv_sec)
  ;
  fVar1 = (float)((double)(result->sys_time).tv_usec / 1000000.0 + (double)(result->sys_time).tv_sec
                 );
  *sys = fVar1;
  *total = fVar1 + *usr;
  return;
}

Assistant:

void
zt_time_result_to_elapsed(struct time_result *result, float *usr, float *sys, float *total)
{
    zt_assert(result);
    zt_assert(usr);
    zt_assert(sys);
    zt_assert(total);

    *usr = (float) (result->usr_time.tv_sec + result->usr_time.tv_usec / 1000000.0);
    *sys = (float) (result->sys_time.tv_sec + result->sys_time.tv_usec / 1000000.0);
    *total = *usr + *sys;
}